

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rldic1(DisasContext_conflict10 *ctx)

{
  DisasContext_conflict10 *ctx_local;
  
  gen_rldic(ctx,0,1);
  return;
}

Assistant:

static void gen_rldnm(DisasContext *ctx, int mb, int me)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    TCGv t0;

    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t0, t_rb, 0x3f);
    tcg_gen_rotl_tl(tcg_ctx, t_ra, t_rs, t0);
    tcg_temp_free(tcg_ctx, t0);

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}